

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

list * __thiscall
mjs::parser::parse_variable_declaration_list(list *__return_storage_ptr__,parser *this)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  wstring *pwVar5;
  wostream *pwVar6;
  char *__addr_len;
  wchar_t *extraout_RDX;
  wstring_view *s;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  wstring local_210;
  undefined1 local_1f0 [40];
  wstring id;
  wostringstream _oss;
  
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0._32_8_ = &this->current_token_;
  local_1f0._24_8_ = &this->expression_pos_;
  do {
    if ((this->strict_mode_ == true) && ((this->current_token_).type_ == identifier)) {
      pwVar5 = token::text_abi_cxx11_((token *)local_1f0._32_8_);
      std::__cxx11::wstring::wstring((wstring *)&id,(wstring *)pwVar5);
      name._M_str = extraout_RDX;
      name._M_len = (size_t)id._M_dataplus._M_p;
      bVar4 = is_strict_mode_unassignable_identifier((mjs *)id._M_string_length,name);
      if (bVar4) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
        pwVar6 = std::operator<<((wostream *)&_oss,"\"");
        local_1f0._0_8_ = id._M_string_length;
        local_1f0._8_8_ = id._M_dataplus._M_p;
        cpp_quote_abi_cxx11_(&local_210,(mjs *)local_1f0,s);
        pwVar6 = std::operator<<(pwVar6,(wstring *)&local_210);
        std::operator<<(pwVar6,"\" may not appear in a variable declaration in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_210);
        current_extend((source_extend *)local_1f0,this);
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_210._M_dataplus._M_p;
        syntax_error((parser *)"parse_variable_declaration_list",(char *)0x320,(int)local_1f0,
                     (source_extend *)local_210._M_string_length,message);
      }
      std::__cxx11::wstring::~wstring((wstring *)&id);
    }
    __addr_len = "parse_variable_declaration_list";
    expect((token *)&_oss,this,identifier,"parse_variable_declaration_list",0x324);
    pwVar5 = token::text_abi_cxx11_((token *)&_oss);
    std::__cxx11::wstring::wstring((wstring *)&id,(wstring *)pwVar5);
    token::destroy((token *)&_oss);
    local_210._M_dataplus._M_p = (pointer)0x0;
    accept((parser *)&_oss,(int)this,(sockaddr *)0x1d,(socklen_t *)__addr_len);
    uVar3 = __oss;
    token::destroy((token *)&_oss);
    if (uVar3 != 0x72) {
      this->expression_pos_ = (position_stack_node *)&_oss;
      __oss = this;
      parse_assignment_expression((parser *)local_1f0);
      uVar2 = local_1f0._0_8_;
      _Var1._M_p = local_210._M_dataplus._M_p;
      local_1f0._0_8_ = (element_type *)0x0;
      local_210._M_dataplus._M_p = (pointer)uVar2;
      if ((element_type *)_Var1._M_p != (element_type *)0x0) {
        (**(code **)(*(long *)_Var1._M_p + 8))();
        if ((element_type *)local_1f0._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_1f0._0_8_ + 8))();
        }
      }
      position_stack_node::~position_stack_node((position_stack_node *)&_oss);
    }
    declaration::declaration((declaration *)&_oss,&id,(expression_ptr *)&local_210);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::emplace_back<mjs::declaration>
              (__return_storage_ptr__,(declaration *)&_oss);
    declaration::~declaration((declaration *)&_oss);
    if ((element_type *)local_210._M_dataplus._M_p != (element_type *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
    std::__cxx11::wstring::~wstring((wstring *)&id);
    accept((parser *)&_oss,(int)this,(sockaddr *)0x20,(socklen_t *)__addr_len);
    uVar3 = __oss;
    token::destroy((token *)&_oss);
  } while (uVar3 != 0x72);
  return __return_storage_ptr__;
}

Assistant:

declaration::list parse_variable_declaration_list() {
        declaration::list l;
        do {
            if (strict_mode_ && current_token_type() == token_type::identifier) {
                if (auto n = current_token().text(); is_strict_mode_unassignable_identifier(n)) {
                    // "args" and "arguments" may not be used as variable names
                    SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not appear in a variable declaration in strict mode");
                }
            }

            auto id = EXPECT(token_type::identifier).text();

            expression_ptr init{};
            if (accept(token_type::equal)) {
                RECORD_EXPRESSION_START;
                init = parse_assignment_expression();
            }
            l.push_back(declaration{id, std::move(init)});
        } while (accept(token_type::comma));
        return l;
    }